

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O0

void __thiscall
KktChStep::addChange(KktChStep *this,int type,int row,int col,double valC,double dualC,double dualR)

{
  int iVar1;
  value_type vVar2;
  size_type sVar3;
  type_conflict *ptVar4;
  type *ptVar5;
  reference pvVar6;
  reference pvVar7;
  reference __x;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pvVar8;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  bool bVar9;
  value_type in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  value_type in_XMM2_Qa;
  int ind_23;
  size_t i_25;
  int ind_22;
  size_t i_24;
  int ind_21;
  size_t i_23;
  int ind_20;
  size_t i_22;
  int ind_19;
  size_t i_21;
  int ind_18;
  size_t i_20;
  int ind_17;
  size_t i_19;
  int ind_16;
  size_t i_18;
  int ind_15;
  size_t i_17;
  int ind_14;
  size_t i_16;
  int ind_13;
  size_t i_15;
  int ind_12;
  size_t i_14;
  int ind_11;
  size_t i_13;
  int ind_10;
  size_t i_12;
  int ind_9;
  size_t i_11;
  int ind_8;
  size_t i_10;
  int ind_7;
  size_t i_9;
  int ind_6;
  size_t i_8;
  int ind_5;
  size_t i_7;
  int ind_4;
  size_t i_6;
  int ind_3;
  size_t i_5;
  int ind_2;
  size_t i_4;
  int i_3;
  int i_2;
  int ind_1;
  size_t i_1;
  int ind;
  size_t i;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> upd;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_fffffffffffffaf0;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_fffffffffffffb78;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_fffffffffffffb80;
  type tVar10;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_1d8;
  ulong local_1c8;
  ulong local_1b8;
  ulong local_1a8;
  ulong local_198;
  ulong local_188;
  ulong local_178;
  ulong local_168;
  ulong local_158;
  ulong local_148;
  ulong local_138;
  ulong local_128;
  ulong local_118;
  ulong local_108;
  ulong local_f8;
  ulong local_e8;
  ulong local_d8;
  ulong local_c8;
  ulong local_b8;
  ulong local_a8;
  ulong local_98;
  ulong local_88;
  int local_7c;
  int local_78;
  ulong local_70;
  ulong local_60;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_48;
  value_type local_30;
  value_type local_28;
  value_type local_20;
  int local_14;
  int local_10;
  int local_c;
  
  local_28 = (value_type)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_30 = in_XMM2_Qa;
  local_20 = in_XMM0_Qa;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x1c050c);
  vVar2 = local_20;
  if (local_c == 0) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),(long)local_10);
    *pvVar6 = 1;
  }
  else if (local_c == 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),(long)local_10);
    vVar2 = local_20;
    *pvVar6 = 1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)local_14);
    *pvVar7 = vVar2;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e0),(long)local_14);
    *pvVar7 = local_28;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1f8),(long)local_10);
    *pvVar7 = local_30;
    if ((local_20 != 0.0) || (NAN(local_20))) {
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c0be3);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c0c18);
      for (local_88 = 0;
          sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_48), local_88 < sVar3; local_88 = local_88 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_88);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c0c74);
        iVar1 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_88);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c0c9a);
        tVar10 = *ptVar5;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)iVar1);
        *pvVar7 = tVar10;
      }
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c0cfa);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c0d2f);
      for (local_98 = 0;
          sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_48), local_98 < sVar3; local_98 = local_98 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_98);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c0d8b);
        iVar1 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_98);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c0db1);
        tVar10 = *ptVar5;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x80),(long)iVar1);
        *pvVar7 = tVar10;
      }
    }
  }
  else if (local_c == 2) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)local_14);
    *pvVar7 = local_20;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e0),(long)local_14);
    *pvVar7 = local_28;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_14);
    *pvVar6 = 1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)local_14);
    *pvVar7 = local_30;
  }
  else if (local_c == 3) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1f8),(long)local_10);
    *pvVar7 = local_30;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),(long)local_10);
    *pvVar6 = 1;
    if ((local_20 != 0.0) || (NAN(local_20))) {
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c11df);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c1214);
      for (local_c8 = 0;
          sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_48), local_c8 < sVar3; local_c8 = local_c8 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_c8);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c1270);
        iVar1 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_c8);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c1296);
        tVar10 = *ptVar5;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x98),(long)iVar1);
        *pvVar7 = tVar10;
      }
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c12f9);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c132e);
      for (local_d8 = 0;
          sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_48), local_d8 < sVar3; local_d8 = local_d8 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_d8);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c138a);
        iVar1 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_d8);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c13b0);
        tVar10 = *ptVar5;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb0),(long)iVar1);
        *pvVar7 = tVar10;
      }
    }
  }
  else if (local_c == 4) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),(long)local_10);
    *pvVar6 = 1;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_14);
    *pvVar6 = 1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)local_14);
    *pvVar7 = local_20;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e0),(long)local_14);
    *pvVar7 = local_28;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1f8),(long)local_10);
    *pvVar7 = local_30;
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c150f);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c1544);
    for (local_e8 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_e8 < sVar3; local_e8 = local_e8 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_e8);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c15a0);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_e8);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c15c6);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)iVar1);
      *pvVar7 = tVar10;
    }
  }
  else if (local_c == 5) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),(long)local_10);
    *pvVar6 = 1;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_14);
    *pvVar6 = 1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)local_14);
    *pvVar7 = local_20;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e0),(long)local_14);
    *pvVar7 = local_28;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1f8),(long)local_10);
    *pvVar7 = local_30;
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c1720);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c1755);
    for (local_f8 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_f8 < sVar3; local_f8 = local_f8 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_f8);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c17b1);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_f8);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c17d7);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)iVar1);
      *pvVar7 = tVar10;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c1837);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c186c);
    for (local_108 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_108 < sVar3; local_108 = local_108 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_108);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c18c8);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_108);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c18ee);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x80),(long)iVar1);
      *pvVar7 = tVar10;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c1951);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c1986);
    for (local_118 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_118 < sVar3; local_118 = local_118 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_118);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c19e2);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_118);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c1a08);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)iVar1);
      *pvVar7 = tVar10;
    }
  }
  else if (local_c == 6) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)local_14);
    *pvVar7 = vVar2;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e0),(long)local_14);
    *pvVar7 = local_28;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_14);
    *pvVar6 = 1;
    if ((local_20 != 0.0) || (NAN(local_20))) {
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c1f60);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c1f95);
      for (local_158 = 0;
          sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_48), local_158 < sVar3; local_158 = local_158 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_158);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c1ff1);
        iVar1 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_158);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c2017);
        tVar10 = *ptVar5;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x98),(long)iVar1);
        *pvVar7 = tVar10;
      }
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c207a);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c20af);
      for (local_168 = 0;
          sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_48), local_168 < sVar3; local_168 = local_168 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_168);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c210b);
        iVar1 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_168);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c2131);
        tVar10 = *ptVar5;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb0),(long)iVar1);
        *pvVar7 = tVar10;
      }
    }
  }
  else if (local_c == 7) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)local_14);
    *pvVar7 = vVar2;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e0),(long)local_14);
    *pvVar7 = local_28;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_14);
    *pvVar6 = 1;
    if ((local_20 != 0.0) || (NAN(local_20))) {
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c224c);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c2281);
      for (local_178 = 0;
          sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_48), local_178 < sVar3; local_178 = local_178 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_178);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c22dd);
        iVar1 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_178);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c2303);
        tVar10 = *ptVar5;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x98),(long)iVar1);
        *pvVar7 = tVar10;
      }
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c2366);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x1c239b);
      for (local_188 = 0;
          sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_48), local_188 < sVar3; local_188 = local_188 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_188);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c23f7);
        iVar1 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_188);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c241d);
        tVar10 = *ptVar5;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb0),(long)iVar1);
        *pvVar7 = tVar10;
      }
    }
  }
  else if (local_c == 0xb) {
    __x = std::
          stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
          ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                 *)0x1c2487);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,__x);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c24bc);
    for (local_198 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_198 < sVar3; local_198 = local_198 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_198);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c2518);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_198);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c253e);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x98),(long)iVar1);
      *pvVar7 = tVar10;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c25a1);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,__x);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c25d6);
    for (local_1a8 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_1a8 < sVar3; local_1a8 = local_1a8 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1a8);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c2632);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1a8);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c2658);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb0),(long)iVar1);
      *pvVar7 = tVar10;
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),(long)local_10);
    *pvVar6 = 1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1f8),(long)local_10);
    *pvVar7 = local_30;
  }
  else if (local_c == 0xc) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),(long)local_10);
    *pvVar6 = 1;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_14);
    *pvVar6 = 1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)local_14);
    *pvVar7 = local_20;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e0),(long)local_14);
    *pvVar7 = local_28;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1f8),(long)local_10);
    *pvVar7 = local_30;
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c27f4);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c2823);
    for (local_1b8 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_1b8 < sVar3; local_1b8 = local_1b8 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1b8);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c2879);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1b8);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c289f);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)iVar1);
      *pvVar7 = tVar10;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c28f9);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c2928);
    for (local_1c8 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_1c8 < sVar3; local_1c8 = local_1c8 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1c8);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c297e);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1c8);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c29a4);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x80),(long)iVar1);
      *pvVar7 = tVar10;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c2a01);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c2a30);
    local_1d8 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x0;
    while (in_stack_fffffffffffffaf0 = local_1d8,
          pvVar8 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                   size(&local_48), in_stack_fffffffffffffaf0 < pvVar8) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,(size_type)local_1d8);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c2a86);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,(size_type)local_1d8);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c2aac);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)iVar1);
      *pvVar7 = tVar10;
      local_1d8 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  ((long)&(local_1d8->
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  else if (local_c == 0x11) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),(long)local_10);
    *pvVar6 = 1;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_14);
    *pvVar6 = 1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c8),(long)local_14);
    *pvVar7 = local_20;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e0),(long)local_14);
    *pvVar7 = local_28;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1f8),(long)local_10);
    *pvVar7 = local_30;
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c1b62);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c1b97);
    for (local_128 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_128 < sVar3; local_128 = local_128 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_128);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c1bf3);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_128);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c1c19);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)iVar1);
      *pvVar7 = tVar10;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c1c79);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c1cae);
    for (local_138 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_138 < sVar3; local_138 = local_138 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_138);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c1d0a);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_138);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c1d30);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x80),(long)iVar1);
      *pvVar7 = tVar10;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c1d93);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c1dc8);
    for (local_148 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_148 < sVar3; local_148 = local_148 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_148);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c1e24);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_148);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c1e4a);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)iVar1);
      *pvVar7 = tVar10;
    }
  }
  else if (local_c == 0x15) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1f8),(long)local_10);
    *pvVar7 = local_30;
  }
  else if (local_c == 0x16) {
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c0f30);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c0f65);
    for (local_a8 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_a8 < sVar3; local_a8 = local_a8 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_a8);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c0fc1);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_a8);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c0fe7);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x98),(long)iVar1);
      *pvVar7 = tVar10;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c104a);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c107f);
    for (local_b8 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_b8 < sVar3; local_b8 = local_b8 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_b8);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c10db);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_b8);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c1101);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb0),(long)iVar1);
      *pvVar7 = tVar10;
    }
  }
  else if (local_c == 0x79) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e0),(long)local_14);
    *pvVar7 = local_28;
  }
  else if (local_c == 0xab) {
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c065d);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c0692);
    for (local_60 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_60 < sVar3; local_60 = local_60 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_60);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c06ee);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_60);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c0714);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x98),(long)iVar1);
      *pvVar7 = tVar10;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c079d);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x1c07d2);
    for (local_70 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_70 < sVar3; local_70 = local_70 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_70);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x1c082e);
      iVar1 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_70);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x1c0854);
      tVar10 = *ptVar5;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb0),(long)iVar1);
      *pvVar7 = tVar10;
    }
  }
  else if (local_c == 0xac) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_10);
    local_78 = *pvVar6;
    while( true ) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)(local_10 + 1));
      bVar9 = false;
      if (local_78 < *pvVar6) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_78);
        bVar9 = *pvVar6 != local_14;
      }
      if (!bVar9) break;
      local_78 = local_78 + 1;
    }
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),(long)local_78);
    *pvVar7 = local_20;
  }
  else if (local_c == 0xad) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_10);
    local_7c = *pvVar6;
    while( true ) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)(local_10 + 1));
      bVar9 = false;
      if (local_7c < *pvVar6) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_7c);
        bVar9 = *pvVar6 != local_14;
      }
      if (!bVar9) break;
      local_7c = local_7c + 1;
    }
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),(long)local_7c);
    *pvVar7 = local_20;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_7c);
    *pvVar6 = (int)local_28;
  }
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
            (in_stack_fffffffffffffaf0);
  return;
}

Assistant:

void KktChStep::addChange(int type, int row, int col, double valC, double dualC, double dualR) {
//when updating fill new values for b, c, bounds in Rb RcolCost RcolUpper, RcolLower
	vector<pair<int, double>> upd;
	
	switch(type) {
	case 171: //new bounds from doubleton equation, retrieve old ones
		upd =  rLowers.top();
		rLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowLower[ind] = get<1>(upd[i]);
		}
		upd =  rUppers.top();
		rUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowUpper[ind] = get<1>(upd[i]);
		}
		break;
	case 172:{ //matrix transformation from doubleton equation, retrieve old value
		//here col is x, the value of which we are changing back.
		//valC is the old value of the x entry in the matrix
		int i = ARstart[row];
		while (i<ARstart[row+1] && ARindex[i]!= col) i++;
		ARvalue[i] = valC;
		break;
	}
	case 173:{ //matrix transformation from doubleton equation, retrieve old value
		//here col is x, the value of which we are changing back.
		//valC is the old value of the x entry in the matrix
		int i = ARstart[row];
		while (i<ARstart[row+1] && ARindex[i]!= col) i++;
		ARvalue[i] = valC;
		ARindex[i] = (int) dualC;
		break;
	}
	case 0:  //empty row
		flagRow[row] = 1;
		break;
	case 1:  //row singleton
		flagRow[row] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
		if (valC != 0) {
			upd =  cLowers.top();
			cLowers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RcolLower[ind] = get<1>(upd[i]);
			}
			upd =  cUppers.top();
			cUppers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RcolUpper[ind] = get<1>(upd[i]);
			}
		}
		break;
	case 2: //each variable at forcing row: rowDual is cost here
		colValue[col] = valC;
		colDual[col] = dualC;
		flagCol[col] = 1;
		RcolCost[col] = dualR;
		break;
	case 21: //
		rowDual[row] = dualR;
		break;
	case 22: //
		upd =  rLowers.top();
		rLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowLower[ind] = get<1>(upd[i]);
		}
		upd =  rUppers.top();
		rUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowUpper[ind] = get<1>(upd[i]);
		}
		break;
	case 3: //the row that is forcing 
		rowDual[row] = dualR;
		flagRow[row] = 1;
		if (valC != 0) {
			upd =  rLowers.top();
			rLowers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowLower[ind] = get<1>(upd[i]);
			}
			upd =  rUppers.top();
			rUppers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowUpper[ind] = get<1>(upd[i]);
			}
		}
		break;
	case 4: //implied free column singleton (also from duplicate row)
		flagRow[row] = 1;
		flagCol[col] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
		upd =  costs.top();
		costs.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolCost[ind] = get<1>(upd[i]);
		}
		break;
	case 5: //doubleton eq with singleton col
		flagRow[row] = 1;
		flagCol[col] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
		upd =  cLowers.top();
		cLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolLower[ind] = get<1>(upd[i]);
		}
		upd =  cUppers.top();
		cUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolUpper[ind] = get<1>(upd[i]);
		}
		upd =  costs.top();
		costs.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolCost[ind] = get<1>(upd[i]);
		}
		break;
	case 17: {//doubleton equation
		flagRow[row] = 1;
		flagCol[col] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
		upd =  cLowers.top();
		cLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolLower[ind] = get<1>(upd[i]);
		}
		upd =  cUppers.top();
		cUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolUpper[ind] = get<1>(upd[i]);
		}
		upd =  costs.top();
		costs.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolCost[ind] = get<1>(upd[i]);
		}
		break;
	}
	case 6: //empty column, dominated column or weakly dominated
		colValue[col] = valC;
		colDual[col] = dualC;
		flagCol[col] = 1;
		if (valC != 0) {
			upd =  rLowers.top();
			rLowers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowLower[ind] = get<1>(upd[i]);
			}
			upd =  rUppers.top();
			rUppers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowUpper[ind] = get<1>(upd[i]);
			}
		}
		break;
	case 7: //fixed variable
		colValue[col] = valC;
		colDual[col] = dualC;
		flagCol[col] = 1;
		if (valC != 0) {
			upd =  rLowers.top();
			rLowers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowLower[ind] = get<1>(upd[i]);
			}
			upd =  rUppers.top();
			rUppers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowUpper[ind] = get<1>(upd[i]);
			}
		}
		break;
	case 11: //empty row from duplucate rows
		upd =  rLowers.top();
		rLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowLower[ind] = get<1>(upd[i]);
		}
		upd =  rUppers.top();
		rUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowUpper[ind] = get<1>(upd[i]);
		}
		flagRow[row] = 1;
		rowDual[row] = dualR;
		break;
	case 12: //doubleton eq from dupliocate rows;
		flagRow[row] = 1;
		flagCol[col] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
				upd =  cLowers.top();
		cLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolLower[ind] = get<1>(upd[i]);
		}
		upd =  cUppers.top();
		cUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolUpper[ind] = get<1>(upd[i]);
		}
		upd =  costs.top();
		costs.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolCost[ind] = get<1>(upd[i]);
		}
		break;
	case 121: //
		colDual[col] = dualC;
		break;/*
	case 14: //two duplicate columns by one 
		colValue[col] = valC;
		colDual[col] = dualC;
		RcolLower = cLowers.top(); cLowers.pop();
		RcolUpper = cUppers.top(); cUppers.pop();
		break;
	case 15: //sing variable on initEq
		flagRow[row] = true;
		rowDual[row] = dualR;
		break;*/
	}
}